

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O2

void __thiscall flatbuffers::FlatBufferBuilder::Align(FlatBufferBuilder *this,size_t elem_size)

{
  if (this->minalign_ < elem_size) {
    this->minalign_ = elem_size;
  }
  vector_downward::fill
            (&this->buf_,
             elem_size - 1 &
             -(ulong)(uint)(((int)(this->buf_).reserved_ - *(int *)&(this->buf_).cur_) +
                           *(int *)&(this->buf_).buf_));
  return;
}

Assistant:

void Align(size_t elem_size) {
    if (elem_size > minalign_) minalign_ = elem_size;
    buf_.fill(PaddingBytes(buf_.size(), elem_size));
  }